

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.hpp
# Opt level: O2

iterator_range<burst::merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>_>
* __thiscall
burst::merge_t::operator()
          (iterator_range<burst::merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>_>
           *__return_storage_ptr__,merge_t *this,
          tuple<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&>
          *args)

{
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  *in_RCX;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  end;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  begin;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *local_118;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *piStack_110;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  local_100;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  local_c8;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  local_90;
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  local_58;
  
  local_118 = (args->
              super__Tuple_impl<0UL,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&>
              ).
              super__Tuple_impl<1UL,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&>
              .
              super__Head_base<1UL,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_false>
              ._M_head_impl;
  piStack_110 = (args->
                super__Tuple_impl<0UL,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&>
                ).
                super__Head_base<0UL,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_false>
                ._M_head_impl;
  make_merge_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            (&local_58,(burst *)&local_118,args);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::merge_iterator(&local_90,&local_58);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::merge_iterator(&local_c8,&local_58);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::merge_iterator(&local_100,&local_90);
  boost::
  make_iterator_range<burst::merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>,std::less<void>>>
            (__return_storage_ptr__,(boost *)&local_c8,&local_100,in_RCX);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::~merge_iterator(&local_100);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::~merge_iterator(&local_c8);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::~merge_iterator(&local_90);
  merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
  ::~merge_iterator(&local_58);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_merge_iterator(std::forward<Args>(args)...);
            auto end = make_merge_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }